

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::Queue
          (Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this,size_t capacity)

{
  *(undefined8 *)((long)&(this->m_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_).super___mutex_base._M_mutex + 8) = 0;
  (this->m_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cv_);
  this->elements_ = 0;
  this->capacity_ = capacity;
  this->closed_ = false;
  std::
  _Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::_Deque_base(&(this->write_).
                 super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
               );
  std::
  _Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::_Deque_base(&(this->read_).
                 super__Deque_base<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
               );
  return;
}

Assistant:

Queue(size_t capacity) :
      elements_(0),
      capacity_(capacity),
      closed_(false) {
  }